

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O2

void fdct16x16_new_avx2(__m256i *input,__m256i *output,int8_t cos_bit)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  __m256i alVar12;
  __m256i w0;
  __m256i w0_00;
  __m256i w0_01;
  __m256i w0_02;
  __m256i w0_03;
  __m256i w0_04;
  __m256i w0_05;
  __m256i w0_06;
  __m256i w0_07;
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i w1_02;
  __m256i w1_03;
  __m256i w1_04;
  __m256i w1_05;
  __m256i w1_06;
  __m256i w1_07;
  __m256i w1_08;
  __m256i w1_09;
  __m256i w1_10;
  __m256i w1_11;
  __m256i _r;
  __m256i _r_00;
  __m256i _r_01;
  __m256i _r_02;
  __m256i _r_03;
  __m256i _r_04;
  __m256i _r_05;
  __m256i _r_06;
  __m256i _r_07;
  __m256i _r_08;
  __m256i _r_09;
  __m256i _r_10;
  __m256i _r_11;
  long lVar13;
  int cos_bit_00;
  int iVar14;
  undefined7 in_register_00000011;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  undefined1 in_stack_fffffffffffffb40 [24];
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  __m256i local_420;
  __m256i local_400;
  __m256i local_3e0;
  __m256i local_3c0;
  __m256i local_3a0;
  __m256i local_380;
  __m256i local_360;
  __m256i local_340;
  __m256i local_320;
  __m256i local_300;
  __m256i local_2e0;
  __m256i local_2c0;
  __m256i local_2a0;
  __m256i local_280;
  __m256i local_260;
  __m256i local_240;
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  int local_200;
  int iStack_1fc;
  int iStack_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int iStack_1e8;
  int iStack_1e4;
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  uint local_c0;
  uint uStack_bc;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  cos_bit_00 = (int)CONCAT71(in_register_00000011,cos_bit);
  lVar13 = (long)cos_bit_00 * 0x100;
  iVar14 = 1 << (cos_bit - 1U & 0x1f);
  uVar23 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1e0);
  local_220 = (uVar23 & 0xffff) + uVar23 * -0x10000;
  iVar16 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x220);
  iVar17 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1a0);
  uVar15 = iVar16 << 0x10 | -iVar17 & 0xffffU;
  local_200 = (-iVar16 & 0xffffU) + iVar17 * -0x10000;
  auVar1 = vpaddsw_avx2((undefined1  [32])*input,(undefined1  [32])input[0xf]);
  local_240 = (__m256i)vpsubsw_avx2((undefined1  [32])*input,(undefined1  [32])input[0xf]);
  auVar2 = vpaddsw_avx2((undefined1  [32])input[1],(undefined1  [32])input[0xe]);
  local_260 = (__m256i)vpsubsw_avx2((undefined1  [32])input[1],(undefined1  [32])input[0xe]);
  auVar3 = vpaddsw_avx2((undefined1  [32])input[2],(undefined1  [32])input[0xd]);
  local_280 = (__m256i)vpsubsw_avx2((undefined1  [32])input[2],(undefined1  [32])input[0xd]);
  auVar4 = vpaddsw_avx2((undefined1  [32])input[0xc],(undefined1  [32])input[3]);
  local_2a0 = (__m256i)vpsubsw_avx2((undefined1  [32])input[3],(undefined1  [32])input[0xc]);
  auVar5 = vpaddsw_avx2((undefined1  [32])input[0xb],(undefined1  [32])input[4]);
  local_2c0 = (__m256i)vpsubsw_avx2((undefined1  [32])input[4],(undefined1  [32])input[0xb]);
  auVar6 = vpaddsw_avx2((undefined1  [32])input[10],(undefined1  [32])input[5]);
  local_2e0 = (__m256i)vpsubsw_avx2((undefined1  [32])input[5],(undefined1  [32])input[10]);
  local_300 = (__m256i)vpsubsw_avx2((undefined1  [32])input[6],(undefined1  [32])input[9]);
  auVar7 = vpaddsw_avx2((undefined1  [32])input[9],(undefined1  [32])input[6]);
  auVar8 = vpaddsw_avx2((undefined1  [32])input[7],(undefined1  [32])input[8]);
  local_320 = (__m256i)vpsubsw_avx2((undefined1  [32])input[7],(undefined1  [32])input[8]);
  uVar23 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x240);
  iVar16 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x180);
  local_1c0 = iVar16 << 0x10 | uVar23 & 0xffff;
  local_420 = (__m256i)vpaddsw_avx2(auVar1,auVar8);
  local_1e0 = uVar23 << 0x10 | -iVar16 & 0xffffU;
  local_340 = (__m256i)vpsubsw_avx2(auVar1,auVar8);
  uVar23 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1c0);
  iVar16 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x200);
  local_180 = iVar16 << 0x10 | uVar23 & 0xffff;
  local_400 = (__m256i)vpaddsw_avx2(auVar2,auVar7);
  local_1a0 = uVar23 << 0x10 | -iVar16 & 0xffffU;
  local_360 = (__m256i)vpsubsw_avx2(auVar2,auVar7);
  uVar23 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x250);
  iVar16 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x170);
  local_140 = iVar16 << 0x10 | uVar23 & 0xffff;
  local_3e0 = (__m256i)vpaddsw_avx2(auVar3,auVar6);
  local_160 = uVar23 << 0x10 | -iVar16 & 0xffffU;
  local_380 = (__m256i)vpsubsw_avx2(auVar3,auVar6);
  uVar23 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1d0);
  iVar16 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1f0);
  local_100 = iVar16 << 0x10 | uVar23 & 0xffff;
  local_3c0 = (__m256i)vpaddsw_avx2(auVar5,auVar4);
  local_120 = uVar23 << 0x10 | -iVar16 & 0xffffU;
  local_3a0 = (__m256i)vpsubsw_avx2(auVar4,auVar5);
  uVar23 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x210);
  iVar16 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1b0);
  local_c0 = iVar16 << 0x10 | uVar23 & 0xffff;
  local_e0 = uVar23 << 0x10 | -iVar16 & 0xffffU;
  uVar23 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 400);
  iVar16 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x230);
  local_80 = iVar16 << 0x10 | uVar23 & 0xffff;
  local_a0 = uVar23 << 0x10 | -iVar16 & 0xffffU;
  alVar9[0]._4_4_ = iVar14;
  alVar9[0]._0_4_ = iVar14;
  alVar9[1]._0_4_ = iVar14;
  alVar9[1]._4_4_ = iVar14;
  alVar9[2]._0_4_ = iVar14;
  alVar9[2]._4_4_ = iVar14;
  alVar9[3]._0_4_ = iVar14;
  alVar9[3]._4_4_ = iVar14;
  w1[3] = (longlong)output;
  w1._0_24_ = in_stack_fffffffffffffb40;
  _r[0]._4_4_ = uVar15;
  _r[0]._0_4_ = uVar15;
  _r[1]._0_4_ = uVar15;
  _r[1]._4_4_ = uVar15;
  _r[2]._0_4_ = uVar15;
  _r[2]._4_4_ = uVar15;
  _r[3]._0_4_ = uVar15;
  _r[3]._4_4_ = uVar15;
  iVar16 = iVar14;
  iVar17 = iVar14;
  iVar18 = iVar14;
  iVar19 = iVar14;
  iVar20 = iVar14;
  iVar21 = iVar14;
  iVar22 = iVar14;
  uVar23 = uVar15;
  uVar24 = uVar15;
  uVar25 = uVar15;
  uVar26 = uVar15;
  uVar27 = uVar15;
  uVar28 = uVar15;
  uVar29 = uVar15;
  iStack_21c = local_220;
  iStack_218 = local_220;
  iStack_214 = local_220;
  iStack_210 = local_220;
  iStack_20c = local_220;
  iStack_208 = local_220;
  iStack_204 = local_220;
  iStack_1fc = local_200;
  iStack_1f8 = local_200;
  iStack_1f4 = local_200;
  iStack_1f0 = local_200;
  iStack_1ec = local_200;
  iStack_1e8 = local_200;
  iStack_1e4 = local_200;
  uStack_1dc = local_1e0;
  uStack_1d8 = local_1e0;
  uStack_1d4 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1cc = local_1e0;
  uStack_1c8 = local_1e0;
  uStack_1c4 = local_1e0;
  uStack_1bc = local_1c0;
  uStack_1b8 = local_1c0;
  uStack_1b4 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1ac = local_1c0;
  uStack_1a8 = local_1c0;
  uStack_1a4 = local_1c0;
  uStack_19c = local_1a0;
  uStack_198 = local_1a0;
  uStack_194 = local_1a0;
  uStack_190 = local_1a0;
  uStack_18c = local_1a0;
  uStack_188 = local_1a0;
  uStack_184 = local_1a0;
  uStack_17c = local_180;
  uStack_178 = local_180;
  uStack_174 = local_180;
  uStack_170 = local_180;
  uStack_16c = local_180;
  uStack_168 = local_180;
  uStack_164 = local_180;
  uStack_15c = local_160;
  uStack_158 = local_160;
  uStack_154 = local_160;
  uStack_150 = local_160;
  uStack_14c = local_160;
  uStack_148 = local_160;
  uStack_144 = local_160;
  uStack_13c = local_140;
  uStack_138 = local_140;
  uStack_134 = local_140;
  uStack_130 = local_140;
  uStack_12c = local_140;
  uStack_128 = local_140;
  uStack_124 = local_140;
  uStack_11c = local_120;
  uStack_118 = local_120;
  uStack_114 = local_120;
  uStack_110 = local_120;
  uStack_10c = local_120;
  uStack_108 = local_120;
  uStack_104 = local_120;
  uStack_fc = local_100;
  uStack_f8 = local_100;
  uStack_f4 = local_100;
  uStack_f0 = local_100;
  uStack_ec = local_100;
  uStack_e8 = local_100;
  uStack_e4 = local_100;
  uStack_dc = local_e0;
  uStack_d8 = local_e0;
  uStack_d4 = local_e0;
  uStack_d0 = local_e0;
  uStack_cc = local_e0;
  uStack_c8 = local_e0;
  uStack_c4 = local_e0;
  uStack_bc = local_c0;
  uStack_b8 = local_c0;
  uStack_b4 = local_c0;
  uStack_b0 = local_c0;
  uStack_ac = local_c0;
  uStack_a8 = local_c0;
  uStack_a4 = local_c0;
  uStack_9c = local_a0;
  uStack_98 = local_a0;
  uStack_94 = local_a0;
  uStack_90 = local_a0;
  uStack_8c = local_a0;
  uStack_88 = local_a0;
  uStack_84 = local_a0;
  uStack_7c = local_80;
  uStack_78 = local_80;
  uStack_74 = local_80;
  uStack_70 = local_80;
  uStack_6c = local_80;
  uStack_68 = local_80;
  uStack_64 = local_80;
  btf_16_w16_avx2(alVar9,w1,&local_2e0,&local_280,_r,cos_bit_00);
  alVar10[0]._4_4_ = iVar16;
  alVar10[0]._0_4_ = iVar14;
  alVar10[1]._0_4_ = iVar17;
  alVar10[1]._4_4_ = iVar18;
  alVar10[2]._0_4_ = iVar19;
  alVar10[2]._4_4_ = iVar20;
  alVar10[3]._0_4_ = iVar21;
  alVar10[3]._4_4_ = iVar22;
  w1_00[3] = (longlong)output;
  w1_00[0] = in_stack_fffffffffffffb40._0_8_;
  w1_00[1] = in_stack_fffffffffffffb40._8_8_;
  w1_00[2] = in_stack_fffffffffffffb40._16_8_;
  _r_00[0]._4_4_ = uVar23;
  _r_00[0]._0_4_ = uVar15;
  _r_00[1]._0_4_ = uVar24;
  _r_00[1]._4_4_ = uVar25;
  _r_00[2]._0_4_ = uVar26;
  _r_00[2]._4_4_ = uVar27;
  _r_00[3]._0_4_ = uVar28;
  _r_00[3]._4_4_ = uVar29;
  btf_16_w16_avx2(alVar10,w1_00,&local_2c0,&local_2a0,_r_00,cos_bit_00);
  alVar9 = (__m256i)vpaddsw_avx2((undefined1  [32])local_420,(undefined1  [32])local_3c0);
  local_3c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_420,(undefined1  [32])local_3c0);
  alVar10 = (__m256i)vpaddsw_avx2((undefined1  [32])local_400,(undefined1  [32])local_3e0);
  local_3e0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_400,(undefined1  [32])local_3e0);
  alVar11[0]._4_4_ = iVar16;
  alVar11[0]._0_4_ = iVar14;
  alVar11[1]._0_4_ = iVar17;
  alVar11[1]._4_4_ = iVar18;
  alVar11[2]._0_4_ = iVar19;
  alVar11[2]._4_4_ = iVar20;
  alVar11[3]._0_4_ = iVar21;
  alVar11[3]._4_4_ = iVar22;
  w1_01[3] = (longlong)output;
  w1_01[0] = in_stack_fffffffffffffb40._0_8_;
  w1_01[1] = in_stack_fffffffffffffb40._8_8_;
  w1_01[2] = in_stack_fffffffffffffb40._16_8_;
  _r_01[0]._4_4_ = uVar23;
  _r_01[0]._0_4_ = uVar15;
  _r_01[1]._0_4_ = uVar24;
  _r_01[1]._4_4_ = uVar25;
  _r_01[2]._0_4_ = uVar26;
  _r_01[2]._4_4_ = uVar27;
  _r_01[3]._0_4_ = uVar28;
  _r_01[3]._4_4_ = uVar29;
  local_420 = alVar9;
  local_400 = alVar10;
  btf_16_w16_avx2(alVar11,w1_01,&local_380,&local_360,_r_01,cos_bit_00);
  alVar9 = (__m256i)vpaddsw_avx2((undefined1  [32])local_320,(undefined1  [32])local_2c0);
  local_2c0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_320,(undefined1  [32])local_2c0);
  alVar10 = (__m256i)vpaddsw_avx2((undefined1  [32])local_300,(undefined1  [32])local_2e0);
  local_2e0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_300,(undefined1  [32])local_2e0);
  alVar11 = (__m256i)vpaddsw_avx2((undefined1  [32])local_240,(undefined1  [32])local_2a0);
  local_2a0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_240,(undefined1  [32])local_2a0);
  alVar12 = (__m256i)vpaddsw_avx2((undefined1  [32])local_260,(undefined1  [32])local_280);
  local_280 = (__m256i)vpsubsw_avx2((undefined1  [32])local_260,(undefined1  [32])local_280);
  w0[0]._4_4_ = iVar16;
  w0[0]._0_4_ = iVar14;
  w0[1]._0_4_ = iVar17;
  w0[1]._4_4_ = iVar18;
  w0[2]._0_4_ = iVar19;
  w0[2]._4_4_ = iVar20;
  w0[3]._0_4_ = iVar21;
  w0[3]._4_4_ = iVar22;
  w1_02[3] = (longlong)output;
  w1_02[0] = in_stack_fffffffffffffb40._0_8_;
  w1_02[1] = in_stack_fffffffffffffb40._8_8_;
  w1_02[2] = in_stack_fffffffffffffb40._16_8_;
  _r_02[0]._4_4_ = uVar23;
  _r_02[0]._0_4_ = uVar15;
  _r_02[1]._0_4_ = uVar24;
  _r_02[1]._4_4_ = uVar25;
  _r_02[2]._0_4_ = uVar26;
  _r_02[2]._4_4_ = uVar27;
  _r_02[3]._0_4_ = uVar28;
  _r_02[3]._4_4_ = uVar29;
  local_320 = alVar9;
  local_300 = alVar10;
  local_260 = alVar12;
  local_240 = alVar11;
  btf_16_w16_avx2(w0,w1_02,&local_420,&local_400,_r_02,cos_bit_00);
  alVar12[0]._4_4_ = iVar16;
  alVar12[0]._0_4_ = iVar14;
  alVar12[1]._0_4_ = iVar17;
  alVar12[1]._4_4_ = iVar18;
  alVar12[2]._0_4_ = iVar19;
  alVar12[2]._4_4_ = iVar20;
  alVar12[3]._0_4_ = iVar21;
  alVar12[3]._4_4_ = iVar22;
  w1_03[3] = (longlong)output;
  w1_03[0] = in_stack_fffffffffffffb40._0_8_;
  w1_03[1] = in_stack_fffffffffffffb40._8_8_;
  w1_03[2] = in_stack_fffffffffffffb40._16_8_;
  _r_03[0]._4_4_ = uVar23;
  _r_03[0]._0_4_ = uVar15;
  _r_03[1]._0_4_ = uVar24;
  _r_03[1]._4_4_ = uVar25;
  _r_03[2]._0_4_ = uVar26;
  _r_03[2]._4_4_ = uVar27;
  _r_03[3]._0_4_ = uVar28;
  _r_03[3]._4_4_ = uVar29;
  btf_16_w16_avx2(alVar12,w1_03,&local_3e0,&local_3c0,_r_03,cos_bit_00);
  alVar9 = (__m256i)vpaddsw_avx2((undefined1  [32])local_3a0,(undefined1  [32])local_380);
  local_380 = (__m256i)vpsubsw_avx2((undefined1  [32])local_3a0,(undefined1  [32])local_380);
  alVar10 = (__m256i)vpaddsw_avx2((undefined1  [32])local_340,(undefined1  [32])local_360);
  local_360 = (__m256i)vpsubsw_avx2((undefined1  [32])local_340,(undefined1  [32])local_360);
  w0_00[0]._4_4_ = iVar16;
  w0_00[0]._0_4_ = iVar14;
  w0_00[1]._0_4_ = iVar17;
  w0_00[1]._4_4_ = iVar18;
  w0_00[2]._0_4_ = iVar19;
  w0_00[2]._4_4_ = iVar20;
  w0_00[3]._0_4_ = iVar21;
  w0_00[3]._4_4_ = iVar22;
  w1_04[3] = (longlong)output;
  w1_04[0] = in_stack_fffffffffffffb40._0_8_;
  w1_04[1] = in_stack_fffffffffffffb40._8_8_;
  w1_04[2] = in_stack_fffffffffffffb40._16_8_;
  _r_04[0]._4_4_ = uVar23;
  _r_04[0]._0_4_ = uVar15;
  _r_04[1]._0_4_ = uVar24;
  _r_04[1]._4_4_ = uVar25;
  _r_04[2]._0_4_ = uVar26;
  _r_04[2]._4_4_ = uVar27;
  _r_04[3]._0_4_ = uVar28;
  _r_04[3]._4_4_ = uVar29;
  local_3a0 = alVar9;
  local_340 = alVar10;
  btf_16_w16_avx2(w0_00,w1_04,&local_300,&local_260,_r_04,cos_bit_00);
  w0_01[0]._4_4_ = iVar16;
  w0_01[0]._0_4_ = iVar14;
  w0_01[1]._0_4_ = iVar17;
  w0_01[1]._4_4_ = iVar18;
  w0_01[2]._0_4_ = iVar19;
  w0_01[2]._4_4_ = iVar20;
  w0_01[3]._0_4_ = iVar21;
  w0_01[3]._4_4_ = iVar22;
  w1_05[3] = (longlong)output;
  w1_05[0] = in_stack_fffffffffffffb40._0_8_;
  w1_05[1] = in_stack_fffffffffffffb40._8_8_;
  w1_05[2] = in_stack_fffffffffffffb40._16_8_;
  _r_05[0]._4_4_ = uVar23;
  _r_05[0]._0_4_ = uVar15;
  _r_05[1]._0_4_ = uVar24;
  _r_05[1]._4_4_ = uVar25;
  _r_05[2]._0_4_ = uVar26;
  _r_05[2]._4_4_ = uVar27;
  _r_05[3]._0_4_ = uVar28;
  _r_05[3]._4_4_ = uVar29;
  btf_16_w16_avx2(w0_01,w1_05,&local_2e0,&local_280,_r_05,cos_bit_00);
  w0_02[0]._4_4_ = iVar16;
  w0_02[0]._0_4_ = iVar14;
  w0_02[1]._0_4_ = iVar17;
  w0_02[1]._4_4_ = iVar18;
  w0_02[2]._0_4_ = iVar19;
  w0_02[2]._4_4_ = iVar20;
  w0_02[3]._0_4_ = iVar21;
  w0_02[3]._4_4_ = iVar22;
  w1_06[3] = (longlong)output;
  w1_06[0] = in_stack_fffffffffffffb40._0_8_;
  w1_06[1] = in_stack_fffffffffffffb40._8_8_;
  w1_06[2] = in_stack_fffffffffffffb40._16_8_;
  _r_06[0]._4_4_ = uVar23;
  _r_06[0]._0_4_ = uVar15;
  _r_06[1]._0_4_ = uVar24;
  _r_06[1]._4_4_ = uVar25;
  _r_06[2]._0_4_ = uVar26;
  _r_06[2]._4_4_ = uVar27;
  _r_06[3]._0_4_ = uVar28;
  _r_06[3]._4_4_ = uVar29;
  btf_16_w16_avx2(w0_02,w1_06,&local_3a0,&local_340,_r_06,cos_bit_00);
  w0_03[0]._4_4_ = iVar16;
  w0_03[0]._0_4_ = iVar14;
  w0_03[1]._0_4_ = iVar17;
  w0_03[1]._4_4_ = iVar18;
  w0_03[2]._0_4_ = iVar19;
  w0_03[2]._4_4_ = iVar20;
  w0_03[3]._0_4_ = iVar21;
  w0_03[3]._4_4_ = iVar22;
  w1_07[3] = (longlong)output;
  w1_07[0] = in_stack_fffffffffffffb40._0_8_;
  w1_07[1] = in_stack_fffffffffffffb40._8_8_;
  w1_07[2] = in_stack_fffffffffffffb40._16_8_;
  _r_07[0]._4_4_ = uVar23;
  _r_07[0]._0_4_ = uVar15;
  _r_07[1]._0_4_ = uVar24;
  _r_07[1]._4_4_ = uVar25;
  _r_07[2]._0_4_ = uVar26;
  _r_07[2]._4_4_ = uVar27;
  _r_07[3]._0_4_ = uVar28;
  _r_07[3]._4_4_ = uVar29;
  btf_16_w16_avx2(w0_03,w1_07,&local_380,&local_360,_r_07,cos_bit_00);
  alVar9 = (__m256i)vpaddsw_avx2((undefined1  [32])local_320,(undefined1  [32])local_300);
  local_300 = (__m256i)vpsubsw_avx2((undefined1  [32])local_320,(undefined1  [32])local_300);
  alVar10 = (__m256i)vpaddsw_avx2((undefined1  [32])local_2c0,(undefined1  [32])local_2e0);
  local_2e0 = (__m256i)vpsubsw_avx2((undefined1  [32])local_2c0,(undefined1  [32])local_2e0);
  alVar11 = (__m256i)vpaddsw_avx2((undefined1  [32])local_2a0,(undefined1  [32])local_280);
  local_280 = (__m256i)vpsubsw_avx2((undefined1  [32])local_2a0,(undefined1  [32])local_280);
  alVar12 = (__m256i)vpaddsw_avx2((undefined1  [32])local_240,(undefined1  [32])local_260);
  local_260 = (__m256i)vpsubsw_avx2((undefined1  [32])local_240,(undefined1  [32])local_260);
  w0_04[0]._4_4_ = iVar16;
  w0_04[0]._0_4_ = iVar14;
  w0_04[1]._0_4_ = iVar17;
  w0_04[1]._4_4_ = iVar18;
  w0_04[2]._0_4_ = iVar19;
  w0_04[2]._4_4_ = iVar20;
  w0_04[3]._0_4_ = iVar21;
  w0_04[3]._4_4_ = iVar22;
  w1_08[3] = (longlong)output;
  w1_08[0] = in_stack_fffffffffffffb40._0_8_;
  w1_08[1] = in_stack_fffffffffffffb40._8_8_;
  w1_08[2] = in_stack_fffffffffffffb40._16_8_;
  _r_08[0]._4_4_ = uVar23;
  _r_08[0]._0_4_ = uVar15;
  _r_08[1]._0_4_ = uVar24;
  _r_08[1]._4_4_ = uVar25;
  _r_08[2]._0_4_ = uVar26;
  _r_08[2]._4_4_ = uVar27;
  _r_08[3]._0_4_ = uVar28;
  _r_08[3]._4_4_ = uVar29;
  local_320 = alVar9;
  local_2c0 = alVar10;
  local_2a0 = alVar11;
  local_240 = alVar12;
  btf_16_w16_avx2(w0_04,w1_08,&local_320,&local_240,_r_08,cos_bit_00);
  w0_05[0]._4_4_ = iVar16;
  w0_05[0]._0_4_ = iVar14;
  w0_05[1]._0_4_ = iVar17;
  w0_05[1]._4_4_ = iVar18;
  w0_05[2]._0_4_ = iVar19;
  w0_05[2]._4_4_ = iVar20;
  w0_05[3]._0_4_ = iVar21;
  w0_05[3]._4_4_ = iVar22;
  w1_09[3] = (longlong)output;
  w1_09[0] = in_stack_fffffffffffffb40._0_8_;
  w1_09[1] = in_stack_fffffffffffffb40._8_8_;
  w1_09[2] = in_stack_fffffffffffffb40._16_8_;
  _r_09[0]._4_4_ = uVar23;
  _r_09[0]._0_4_ = uVar15;
  _r_09[1]._0_4_ = uVar24;
  _r_09[1]._4_4_ = uVar25;
  _r_09[2]._0_4_ = uVar26;
  _r_09[2]._4_4_ = uVar27;
  _r_09[3]._0_4_ = uVar28;
  _r_09[3]._4_4_ = uVar29;
  btf_16_w16_avx2(w0_05,w1_09,&local_300,&local_260,_r_09,cos_bit_00);
  w0_06[0]._4_4_ = iVar16;
  w0_06[0]._0_4_ = iVar14;
  w0_06[1]._0_4_ = iVar17;
  w0_06[1]._4_4_ = iVar18;
  w0_06[2]._0_4_ = iVar19;
  w0_06[2]._4_4_ = iVar20;
  w0_06[3]._0_4_ = iVar21;
  w0_06[3]._4_4_ = iVar22;
  w1_10[3] = (longlong)output;
  w1_10[0] = in_stack_fffffffffffffb40._0_8_;
  w1_10[1] = in_stack_fffffffffffffb40._8_8_;
  w1_10[2] = in_stack_fffffffffffffb40._16_8_;
  _r_10[0]._4_4_ = uVar23;
  _r_10[0]._0_4_ = uVar15;
  _r_10[1]._0_4_ = uVar24;
  _r_10[1]._4_4_ = uVar25;
  _r_10[2]._0_4_ = uVar26;
  _r_10[2]._4_4_ = uVar27;
  _r_10[3]._0_4_ = uVar28;
  _r_10[3]._4_4_ = uVar29;
  btf_16_w16_avx2(w0_06,w1_10,&local_2e0,&local_280,_r_10,cos_bit_00);
  w0_07[0]._4_4_ = iVar16;
  w0_07[0]._0_4_ = iVar14;
  w0_07[1]._0_4_ = iVar17;
  w0_07[1]._4_4_ = iVar18;
  w0_07[2]._0_4_ = iVar19;
  w0_07[2]._4_4_ = iVar20;
  w0_07[3]._0_4_ = iVar21;
  w0_07[3]._4_4_ = iVar22;
  w1_11[3] = (longlong)output;
  w1_11[0] = in_stack_fffffffffffffb40._0_8_;
  w1_11[1] = in_stack_fffffffffffffb40._8_8_;
  w1_11[2] = in_stack_fffffffffffffb40._16_8_;
  _r_11[0]._4_4_ = uVar23;
  _r_11[0]._0_4_ = uVar15;
  _r_11[1]._0_4_ = uVar24;
  _r_11[1]._4_4_ = uVar25;
  _r_11[2]._0_4_ = uVar26;
  _r_11[2]._4_4_ = uVar27;
  _r_11[3]._0_4_ = uVar28;
  _r_11[3]._4_4_ = uVar29;
  btf_16_w16_avx2(w0_07,w1_11,&local_2c0,&local_2a0,_r_11,cos_bit_00);
  (*output)[0] = local_420[0];
  (*output)[1] = local_420[1];
  (*output)[2] = local_420[2];
  (*output)[3] = local_420[3];
  output[1][0] = local_320[0];
  output[1][1] = local_320[1];
  output[1][2] = local_320[2];
  output[1][3] = local_320[3];
  output[2][0] = local_3a0[0];
  output[2][1] = local_3a0[1];
  output[2][2] = local_3a0[2];
  output[2][3] = local_3a0[3];
  output[3][0] = local_2a0[0];
  output[3][1] = local_2a0[1];
  output[3][2] = local_2a0[2];
  output[3][3] = local_2a0[3];
  output[4][0] = local_3e0[0];
  output[4][1] = local_3e0[1];
  output[4][2] = local_3e0[2];
  output[4][3] = local_3e0[3];
  output[5][0] = local_2e0[0];
  output[5][1] = local_2e0[1];
  output[5][2] = local_2e0[2];
  output[5][3] = local_2e0[3];
  output[6][0] = local_360[0];
  output[6][1] = local_360[1];
  output[6][2] = local_360[2];
  output[6][3] = local_360[3];
  output[7][0] = local_260[0];
  output[7][1] = local_260[1];
  output[7][2] = local_260[2];
  output[7][3] = local_260[3];
  output[8][0] = local_400[0];
  output[8][1] = local_400[1];
  output[8][2] = local_400[2];
  output[8][3] = local_400[3];
  output[9][0] = local_300[0];
  output[9][1] = local_300[1];
  output[9][2] = local_300[2];
  output[9][3] = local_300[3];
  output[10][0] = local_380[0];
  output[10][1] = local_380[1];
  output[10][2] = local_380[2];
  output[10][3] = local_380[3];
  output[0xb][0] = local_280[0];
  output[0xb][1] = local_280[1];
  output[0xb][2] = local_280[2];
  output[0xb][3] = local_280[3];
  output[0xc][0] = local_3c0[0];
  output[0xc][1] = local_3c0[1];
  output[0xc][2] = local_3c0[2];
  output[0xc][3] = local_3c0[3];
  output[0xd][0] = local_2c0[0];
  output[0xd][1] = local_2c0[1];
  output[0xd][2] = local_2c0[2];
  output[0xd][3] = local_2c0[3];
  output[0xe][0] = local_340[0];
  output[0xe][1] = local_340[1];
  output[0xe][2] = local_340[2];
  output[0xe][3] = local_340[3];
  output[0xf][0] = local_240[0];
  output[0xf][1] = local_240[1];
  output[0xf][2] = local_240[2];
  output[0xf][3] = local_240[3];
  return;
}

Assistant:

static inline void fdct16x16_new_avx2(const __m256i *input, __m256i *output,
                                      int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i _r = _mm256_set1_epi32(1 << (cos_bit - 1));

  __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);
  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);
  __m256i cospi_p56_p08 = pair_set_w16_epi16(cospi[56], cospi[8]);
  __m256i cospi_m08_p56 = pair_set_w16_epi16(-cospi[8], cospi[56]);
  __m256i cospi_p24_p40 = pair_set_w16_epi16(cospi[24], cospi[40]);
  __m256i cospi_m40_p24 = pair_set_w16_epi16(-cospi[40], cospi[24]);
  __m256i cospi_p60_p04 = pair_set_w16_epi16(cospi[60], cospi[4]);
  __m256i cospi_m04_p60 = pair_set_w16_epi16(-cospi[4], cospi[60]);
  __m256i cospi_p28_p36 = pair_set_w16_epi16(cospi[28], cospi[36]);
  __m256i cospi_m36_p28 = pair_set_w16_epi16(-cospi[36], cospi[28]);
  __m256i cospi_p44_p20 = pair_set_w16_epi16(cospi[44], cospi[20]);
  __m256i cospi_m20_p44 = pair_set_w16_epi16(-cospi[20], cospi[44]);
  __m256i cospi_p12_p52 = pair_set_w16_epi16(cospi[12], cospi[52]);
  __m256i cospi_m52_p12 = pair_set_w16_epi16(-cospi[52], cospi[12]);

  // stage 1
  __m256i x1[16];
  btf_16_adds_subs_out_avx2(&x1[0], &x1[15], input[0], input[15]);
  btf_16_adds_subs_out_avx2(&x1[1], &x1[14], input[1], input[14]);
  btf_16_adds_subs_out_avx2(&x1[2], &x1[13], input[2], input[13]);
  btf_16_adds_subs_out_avx2(&x1[3], &x1[12], input[3], input[12]);
  btf_16_adds_subs_out_avx2(&x1[4], &x1[11], input[4], input[11]);
  btf_16_adds_subs_out_avx2(&x1[5], &x1[10], input[5], input[10]);
  btf_16_adds_subs_out_avx2(&x1[6], &x1[9], input[6], input[9]);
  btf_16_adds_subs_out_avx2(&x1[7], &x1[8], input[7], input[8]);

  // stage 2
  btf_16_adds_subs_avx2(&x1[0], &x1[7]);
  btf_16_adds_subs_avx2(&x1[1], &x1[6]);
  btf_16_adds_subs_avx2(&x1[2], &x1[5]);
  btf_16_adds_subs_avx2(&x1[3], &x1[4]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[10], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[11], &x1[12], _r, cos_bit);

  // stage 3
  btf_16_adds_subs_avx2(&x1[0], &x1[3]);
  btf_16_adds_subs_avx2(&x1[1], &x1[2]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[5], &x1[6], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[8], &x1[11]);
  btf_16_adds_subs_avx2(&x1[9], &x1[10]);
  btf_16_adds_subs_avx2(&x1[15], &x1[12]);
  btf_16_adds_subs_avx2(&x1[14], &x1[13]);

  // stage 4
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[0], &x1[1], _r, cos_bit);
  btf_16_w16_avx2(cospi_p48_p16, cospi_m16_p48, &x1[2], &x1[3], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[4], &x1[5]);
  btf_16_adds_subs_avx2(&x1[7], &x1[6]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x1[9], &x1[14], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x1[10], &x1[13], _r, cos_bit);

  // stage 5
  btf_16_w16_avx2(cospi_p56_p08, cospi_m08_p56, &x1[4], &x1[7], _r, cos_bit);
  btf_16_w16_avx2(cospi_p24_p40, cospi_m40_p24, &x1[5], &x1[6], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[8], &x1[9]);
  btf_16_adds_subs_avx2(&x1[11], &x1[10]);
  btf_16_adds_subs_avx2(&x1[12], &x1[13]);
  btf_16_adds_subs_avx2(&x1[15], &x1[14]);

  // stage 6
  btf_16_w16_avx2(cospi_p60_p04, cospi_m04_p60, &x1[8], &x1[15], _r, cos_bit);
  btf_16_w16_avx2(cospi_p28_p36, cospi_m36_p28, &x1[9], &x1[14], _r, cos_bit);
  btf_16_w16_avx2(cospi_p44_p20, cospi_m20_p44, &x1[10], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_p12_p52, cospi_m52_p12, &x1[11], &x1[12], _r, cos_bit);

  // stage 7
  output[0] = x1[0];
  output[1] = x1[8];
  output[2] = x1[4];
  output[3] = x1[12];
  output[4] = x1[2];
  output[5] = x1[10];
  output[6] = x1[6];
  output[7] = x1[14];
  output[8] = x1[1];
  output[9] = x1[9];
  output[10] = x1[5];
  output[11] = x1[13];
  output[12] = x1[3];
  output[13] = x1[11];
  output[14] = x1[7];
  output[15] = x1[15];
}